

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_base64.cpp
# Opt level: O3

string * __thiscall
Omega_h::base64::read_encoded_abi_cxx11_(string *__return_storage_ptr__,base64 *this,istream *f)

{
  uint uVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  while( true ) {
    uVar1 = std::istream::get();
    if ((0x7f < uVar1) || (0x3f < (byte)(anonymous_namespace)::char_to_value[uVar1])) break;
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string read_encoded(std::istream& f) {
  std::string out;
  while (true) {
    int c = f.get();
    if (c < 0 || c > 127) break;
    unsigned char val = char_to_value[c];
    if (val > 63) break;
    out.push_back(static_cast<char>(c));
  }
  return out;
}